

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O1

void PatternMatch_Expression(KonohaContext *kctx,KonohaStack *sfp)

{
  int iVar1;
  int endIdx;
  kNameSpace *stmt;
  kArray *tokenList;
  KClass *pKVar2;
  kNode *o;
  kNameSpace *pkVar3;
  kNameSpace *ns;
  int returnIdx;
  int local_3c;
  uintptr_t local_38;
  
  stmt = (kNameSpace *)sfp[1].field_0.asException;
  local_38 = sfp[2].field_1.unboxValue;
  tokenList = sfp[3].field_0.asArray;
  iVar1 = *(int *)&sfp[4].field_1;
  endIdx = *(int *)&sfp[6].field_1;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_Expression",0x1b,"tracing..");
  pKVar2 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar3 = stmt;
  do {
    ns = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar3->importedNameSpaceList)->StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar3->importedNameSpaceList)->StmtNameSpace->
        h).ct == pKVar2) break;
    pkVar3 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar3->packageId)->RootNodeNameSpace;
    ns = pkVar3;
  } while ((pkVar3->h).ct != pKVar2);
  local_3c = iVar1;
  o = ParseNewNode(kctx,ns,tokenList,&local_3c,endIdx,OnlyPatternMatch,(char *)0x0);
  if (o != *(kNode **)((*kctx->runtimeModels)[1].freeModel + 0xc0)) {
    kNode_AddParsedObject(kctx,(kNode *)stmt,(ksymbol_t)local_38,(kObject_conflict *)o);
  }
  sfp[-4].field_1 = (anon_union_8_10_3f923e25_for_KonohaValueVar_2)(long)local_3c;
  return;
}

Assistant:

static KMETHOD PatternMatch_Expression(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	int returnIdx = beginIdx;
	kNode *expr = ParseNewNode(kctx, kNode_ns(stmt), tokenList, &returnIdx, endIdx, (ParseOption)(ParseExpressionOption|OnlyPatternMatch), NULL);
	if(expr != K_NULLNODE) {
		kNode_AddParsedObject(kctx, stmt, name, UPCAST(expr));
	}
	KReturnUnboxValue(returnIdx);
}